

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUHal.cpp
# Opt level: O2

bool __thiscall RTIMUHal::HALOpen(RTIMUHal *this)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  uchar SPIBits;
  uchar SPIMode;
  uint32_t SPISpeed;
  char buf [32];
  
  SPIMode = '\0';
  SPIBits = '\b';
  SPISpeed = this->m_SPISpeed;
  if (this->m_busIsI2C == true) {
    if (-1 < this->m_I2C) {
      return true;
    }
    if (this->m_I2CBus != 0xff) {
      sprintf(buf,"/dev/i2c-%d");
      iVar2 = open(buf,2);
      this->m_I2C = iVar2;
      if (-1 < iVar2) {
        return true;
      }
      fprintf(_stderr,"Failed to open I2C bus %d\n",(ulong)this->m_I2CBus);
      this->m_I2C = -1;
      return false;
    }
    pcVar4 = "No I2C bus has been set\n";
LAB_0010fa50:
    fwrite(pcVar4,0x18,1,_stderr);
    return false;
  }
  if (this->m_SPIBus == 0xff) {
    pcVar4 = "No SPI bus has been set\n";
    goto LAB_0010fa50;
  }
  sprintf(buf,"/dev/spidev%d.%d",(ulong)this->m_SPIBus,(ulong)this->m_SPISelect);
  iVar2 = open(buf,2);
  this->m_SPI = iVar2;
  if (iVar2 < 0) {
    fprintf(_stderr,"Failed to open SPI bus %d, select %d\n",(ulong)this->m_SPIBus,
            (ulong)this->m_SPISelect);
    this->m_SPI = -1;
    return false;
  }
  iVar2 = ioctl(iVar2,0x40016b01,&SPIMode);
  if (iVar2 < 0) {
    uVar3 = (ulong)this->m_SPIBus;
    pcVar4 = "Failed to set WR SPI_MODE0 on bus %d";
  }
  else {
    iVar2 = ioctl(this->m_SPI,0x80016b01,&SPIMode);
    if (iVar2 < 0) {
      uVar3 = (ulong)this->m_SPIBus;
      pcVar4 = "Failed to set RD SPI_MODE0 on bus %d";
    }
    else {
      iVar2 = ioctl(this->m_SPI,0x40016b03,&SPIBits);
      if (iVar2 < 0) {
        uVar3 = (ulong)this->m_SPIBus;
        pcVar4 = "Failed to set WR 8 bit mode on bus %d";
      }
      else {
        iVar2 = ioctl(this->m_SPI,0x80016b03,&SPIBits);
        if (-1 < iVar2) {
          iVar2 = ioctl(this->m_SPI,0x40046b04,&SPISpeed);
          if (iVar2 < 0) {
            bVar1 = this->m_SPIBus;
            pcVar4 = "Failed to set WR %dHz on bus %d";
          }
          else {
            iVar2 = ioctl(this->m_SPI,0x80046b04,&SPISpeed);
            if (-1 < iVar2) {
              return true;
            }
            bVar1 = this->m_SPIBus;
            pcVar4 = "Failed to set RD %dHz on bus %d";
          }
          fprintf(_stderr,pcVar4,(ulong)SPISpeed,(ulong)bVar1);
          goto LAB_0010fa34;
        }
        uVar3 = (ulong)this->m_SPIBus;
        pcVar4 = "Failed to set RD 8 bit mode on bus %d";
      }
    }
  }
  fprintf(_stderr,pcVar4,uVar3);
LAB_0010fa34:
  close((uint)this->m_SPIBus);
  return false;
}

Assistant:

bool RTIMUHal::HALOpen()
{
    char buf[32];
    unsigned char SPIMode = SPI_MODE_0;
    unsigned char SPIBits = 8;
    uint32_t SPISpeed = m_SPISpeed;

    if (m_busIsI2C) {
        if (m_I2C >= 0)
            return true;

        if (m_I2CBus == 255) {
            HAL_ERROR("No I2C bus has been set\n");
            return false;
        }
        sprintf(buf, "/dev/i2c-%d", m_I2CBus);
        m_I2C = open(buf, O_RDWR);
        if (m_I2C < 0) {
            HAL_ERROR1("Failed to open I2C bus %d\n", m_I2CBus);
            m_I2C = -1;
            return false;
        }
    } else {
        if (m_SPIBus == 255) {
            HAL_ERROR("No SPI bus has been set\n");
            return false;
        }

        sprintf(buf, "/dev/spidev%d.%d", m_SPIBus, m_SPISelect);
        m_SPI = open(buf, O_RDWR);
        if (m_SPI < 0) {
            HAL_ERROR2("Failed to open SPI bus %d, select %d\n", m_SPIBus, m_SPISelect);
            m_SPI = -1;
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_WR_MODE, &SPIMode) < 0) {
            HAL_ERROR1("Failed to set WR SPI_MODE0 on bus %d", m_SPIBus);
            close(m_SPIBus);
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_RD_MODE, &SPIMode) < 0) {
            HAL_ERROR1("Failed to set RD SPI_MODE0 on bus %d", m_SPIBus);
            close(m_SPIBus);
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_WR_BITS_PER_WORD, &SPIBits) < 0) {
            HAL_ERROR1("Failed to set WR 8 bit mode on bus %d", m_SPIBus);
            close(m_SPIBus);
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_RD_BITS_PER_WORD, &SPIBits) < 0) {
            HAL_ERROR1("Failed to set RD 8 bit mode on bus %d", m_SPIBus);
            close(m_SPIBus);
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_WR_MAX_SPEED_HZ, &SPISpeed) < 0) {
             HAL_ERROR2("Failed to set WR %dHz on bus %d", SPISpeed, m_SPIBus);
             close(m_SPIBus);
             return false;
        }

        if (ioctl(m_SPI, SPI_IOC_RD_MAX_SPEED_HZ, &SPISpeed) < 0) {
             HAL_ERROR2("Failed to set RD %dHz on bus %d", SPISpeed, m_SPIBus);
             close(m_SPIBus);
             return false;
        }
    }
    return true;
}